

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGCG_SolverMaxPlus.cpp
# Opt level: O0

void __thiscall
BGCG_SolverMaxPlus::BGCG_SolverMaxPlus
          (BGCG_SolverMaxPlus *this,shared_ptr<const_BayesianGameCollaborativeGraphical> *bgcg,
          size_t maxiter,string *updateType,int verbosity,double damping,size_t nrSolutions,
          size_t nrRestarts)

{
  string *in_RCX;
  size_t in_RDX;
  MaxPlusSolverForBGs *in_RSI;
  undefined8 *in_RDI;
  int in_R8D;
  size_t in_R9;
  double in_XMM0_Qa;
  string local_58 [8];
  size_t in_stack_ffffffffffffffb0;
  BGCG_constPtr *in_stack_ffffffffffffffb8;
  BGCG_Solver *in_stack_ffffffffffffffc0;
  string *updateType_00;
  
  updateType_00 = in_RCX;
  BGCG_Solver::BGCG_Solver
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  std::__cxx11::string::string(local_58,(string *)in_RCX);
  MaxPlusSolverForBGs::MaxPlusSolverForBGs
            (in_RSI,in_RDX,updateType_00,in_R8D,in_XMM0_Qa,in_R9,(size_t)in_stack_ffffffffffffffc0);
  std::__cxx11::string::~string(local_58);
  *in_RDI = &PTR_InitDeadline_00d03d08;
  return;
}

Assistant:

BGCG_SolverMaxPlus::BGCG_SolverMaxPlus(
            const boost::shared_ptr<const BayesianGameCollaborativeGraphical> &bgcg,                
            size_t maxiter,
            std::string updateType,
            int verbosity,
            double damping,
            size_t nrSolutions,
            size_t nrRestarts)
    :
        BGCG_Solver(bgcg,  nrSolutions),
        MaxPlusSolverForBGs(maxiter, updateType, verbosity, damping, nrSolutions, nrRestarts)
{
}